

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O0

int_t mc64sd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *numx,int_t *w,
             int_t *len,int_t *lenl,int_t *lenh,int_t *fc,int_t *iw,int_t *iw4)

{
  int iVar1;
  int local_c4;
  int local_c0;
  int_t idum3;
  int_t idum2;
  int_t idum1;
  int_t wlen;
  int_t nval;
  double rinf;
  double bmax;
  double bmin;
  double bval;
  int_t num;
  int_t cnt;
  int_t mod;
  int_t ii;
  int_t l;
  int_t k;
  int_t j;
  int_t i__;
  int_t i__4;
  int_t i__3;
  int_t i__2;
  int_t i__1;
  int *iperm_local;
  double *a_local;
  int_t *irn_local;
  int_t *ip_local;
  int_t *ne_local;
  int_t *n_local;
  
  _i__2 = iperm + -1;
  irn_local = ip + -1;
  iperm_local = (int *)(a + -1);
  a_local = (double *)(irn + -1);
  ip_local = ne;
  ne_local = n;
  _wlen = dmach("Overflow");
  i__3 = *ne_local;
  for (l = 1; l <= i__3; l = l + 1) {
    fc[(long)l + -1] = l;
    iw[(long)l + -1] = 0;
    len[(long)l + -1] = irn_local[l + 1] - irn_local[l];
  }
  bval._4_4_ = 1;
  num = 1;
  *numx = 0;
  mc64ud_((int_t *)((long)&bval + 4),&num,ne_local,(int_t *)((long)a_local + 4),ip_local,
          irn_local + 1,len,fc,iw,numx,ne_local,iw4,iw4 + (long)(*ne_local + 1) + -1,
          iw4 + (long)(*ne_local * 2 + 1) + -1,iw4 + (long)(*ne_local * 3 + 1) + -1);
  bval._0_4_ = *numx;
  if (bval._0_4_ == *ne_local) {
    rinf = _wlen;
    for (l = 1; l <= *ne_local; l = l + 1) {
      bmin = 0.0;
      i__4 = irn_local[l + 1] + -1;
      for (ii = irn_local[l]; ii <= i__4; ii = ii + 1) {
        if (bmin < *(double *)(iperm_local + (long)ii * 2)) {
          bmin = *(double *)(iperm_local + (long)ii * 2);
        }
      }
      if (bmin < rinf) {
        rinf = bmin;
      }
    }
    rinf = rinf * 1.0010000467300415;
  }
  else {
    rinf = _wlen;
  }
  bmin = 0.0;
  bmax = 0.0;
  idum2 = 0;
  iVar1 = *ne_local;
  for (l = 1; l <= iVar1; l = l + 1) {
    mod = irn_local[l + 1] - irn_local[l];
    lenh[(long)l + -1] = mod;
    len[(long)l + -1] = mod;
    i__4 = irn_local[l + 1] + -1;
    for (ii = irn_local[l]; ii <= i__4; ii = ii + 1) {
      if (*(double *)(iperm_local + (long)ii * 2) < rinf) goto LAB_00120f2f;
    }
    ii = irn_local[l + 1];
LAB_00120f2f:
    lenl[(long)l + -1] = ii - irn_local[l];
    if (lenl[(long)l + -1] != mod) {
      idum2 = idum2 + 1;
      w[(long)idum2 + -1] = l;
    }
  }
  i__3 = *ip_local;
  for (idum3 = 1; idum3 <= i__3; idum3 = idum3 + 1) {
    if (bval._0_4_ == *numx) {
      iVar1 = *ne_local;
      for (k = 1; k <= iVar1; k = k + 1) {
        _i__2[k] = iw[(long)k + -1];
      }
      i__4 = *ip_local;
      for (local_c0 = 1; local_c0 <= i__4; local_c0 = local_c0 + 1) {
        bmax = bmin;
        if (((rinf == bmin) && (!NAN(rinf) && !NAN(bmin))) ||
           (mc64qd_(irn_local + 1,lenl,len,w,&idum2,(double *)(iperm_local + 2),&idum1,&bmin),
           idum1 < 2)) goto LAB_0012152e;
        ii = 1;
        i__ = *ne_local;
        local_c4 = 1;
        while ((local_c4 <= i__ && (ii <= idum2))) {
          l = w[(long)ii + -1];
          j = irn_local[l] + lenl[(long)l + -1];
          cnt = irn_local[l] + len[(long)l + -1];
          while ((cnt = cnt + -1, j <= cnt && (*(double *)(iperm_local + (long)cnt * 2) < bmin))) {
            k = *(int *)((long)a_local + (long)cnt * 4);
            if (iw[(long)k + -1] == l) {
              iw[(long)k + -1] = 0;
              bval._0_4_ = bval._0_4_ + -1;
              fc[(long)(*ne_local - bval._0_4_) + -1] = l;
            }
          }
          lenh[(long)l + -1] = len[(long)l + -1];
          len[(long)l + -1] = (cnt - irn_local[l]) + 1;
          if (lenl[(long)l + -1] == lenh[(long)l + -1]) {
            w[(long)ii + -1] = w[(long)idum2 + -1];
            idum2 = idum2 + -1;
          }
          else {
            ii = ii + 1;
          }
          local_c4 = local_c4 + 1;
        }
        if (bval._0_4_ < *numx) break;
      }
      num = 1;
    }
    else {
      rinf = bmin;
      mc64qd_(irn_local + 1,len,lenh,w,&idum2,(double *)(iperm_local + 2),&idum1,&bmin);
      if (idum1 == 0) break;
      if ((bmin == bmax) && (!NAN(bmin) && !NAN(bmax))) break;
      ii = 1;
      i__4 = *ne_local;
      local_c4 = 1;
      while ((local_c4 <= i__4 && (ii <= idum2))) {
        l = w[(long)ii + -1];
        i__ = irn_local[l] + lenh[(long)l + -1] + -1;
        cnt = irn_local[l] + len[(long)l + -1];
        while ((cnt <= i__ && (bmin <= *(double *)(iperm_local + (long)cnt * 2)))) {
          cnt = cnt + 1;
        }
        lenl[(long)l + -1] = len[(long)l + -1];
        len[(long)l + -1] = cnt - irn_local[l];
        if (lenl[(long)l + -1] == lenh[(long)l + -1]) {
          w[(long)ii + -1] = w[(long)idum2 + -1];
          idum2 = idum2 + -1;
        }
        else {
          ii = ii + 1;
        }
        local_c4 = local_c4 + 1;
      }
      num = 0;
    }
    bval._4_4_ = bval._4_4_ + 1;
    mc64ud_((int_t *)((long)&bval + 4),&num,ne_local,(int_t *)((long)a_local + 4),ip_local,
            irn_local + 1,len,fc,iw,(int_t *)&bval,numx,iw4,iw4 + (long)(*ne_local + 1) + -1,
            iw4 + (long)(*ne_local * 2 + 1) + -1,iw4 + (long)(*ne_local * 3 + 1) + -1);
  }
LAB_0012152e:
  if (*numx != *ne_local) {
    iVar1 = *ne_local;
    for (l = 1; l <= iVar1; l = l + 1) {
      w[(long)l + -1] = 0;
    }
    ii = 0;
    iVar1 = *ne_local;
    for (k = 1; k <= iVar1; k = k + 1) {
      if (_i__2[k] == 0) {
        ii = ii + 1;
        iw[(long)ii + -1] = k;
      }
      else {
        w[(long)_i__2[k] + -1] = k;
      }
    }
    ii = 0;
    iVar1 = *ne_local;
    for (l = 1; l <= iVar1; l = l + 1) {
      if (w[(long)l + -1] == 0) {
        ii = ii + 1;
        _i__2[iw[(long)ii + -1]] = l;
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64sd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *numx, int_t *w, 
	int_t *len, int_t *lenl, int_t *lenh, int_t *fc, int_t *iw, 
	int_t *iw4)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, l, ii, mod, cnt, num;
    double bval, bmin, bmax, rinf;
    int_t nval, wlen, idum1, idum2, idum3;
    extern /* Subroutine */ int_t
	mc64qd_(int_t *, int_t *, int_t *, int_t *, int_t *, double *,
		int_t *, double *), 
	mc64ud_(int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *);

/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN, are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(k). The entries in each column must be */
/*   non-negative and ordered by decreasing value. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   bottleneck matching: IPERM(I) - 0 or row I is matched to column */
/*   IPERM(I). */
/* NUMX is an INT_T variable. On exit, it contains the cardinality */
/*   of the matching stored in IPERM. */
/* IW is an INT_T work array of length 10N. */
/* FC is an int_t array of length N that contains the list of */
/*   unmatched columns. */
/* LEN(J), LENL(J), LENH(J) are int_t arrays of length N that point */
/*   to entries in matrix column J. */
/*   In the matrix defined by the column parts IP(J)+LENL(J) we know */
/*   a matching does not exist; in the matrix defined by the column */
/*   parts IP(J)+LENH(J) we know one exists. */
/*   LEN(J) lies between LENL(J) and LENH(J) and determines the matrix */
/*   that is tested for a maximum matching. */
/* W is an int_t array of length N and contains the indices of the */
/*   columns for which LENL ne LENH. */
/* WLEN is number of indices stored in array W. */
/* IW is int_t work array of length N. */
/* IW4 is int_t work array of length 4N used by MC64U/UD. */
/*      EXTERNAL FD05AD,MC64QD,MC64UD */
/*      DOUBLE PRECISION FD05AD */
/* BMIN and BMAX are such that a maximum matching exists for the input */
/*   matrix in which all entries smaller than BMIN are dropped. */
/*   For BMAX, a maximum matching does not exist. */
/* BVAL is a value between BMIN and BMAX. */
/* CNT is the number of calls made to MC64U/UD so far. */
/* NUM is the cardinality of last matching found. */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --iw4;
    --iw;
    --fc;
    --lenh;
    --lenl;
    --len;
    --w;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Compute a first maximum matching from scratch on whole matrix. */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	fc[j] = j;
	iw[j] = 0;
	len[j] = ip[j + 1] - ip[j];
/* L20: */
    }
/* The first call to MC64U/UD */
    cnt = 1;
    mod = 1;
    *numx = 0;
    mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], numx,
	     n, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*n * 3 + 1]);
/* IW contains a maximum matching of length NUMX. */
    num = *numx;
    if (num != *n) {
/* Matrix is structurally singular */
	bmax = rinf;
    } else {
/* Matrix is structurally nonsingular, NUM=NUMX=N; */
/* Set BMAX just above the smallest of all the maximum absolute */
/* values of the columns */
	bmax = rinf;
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    bval = 0.f;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if (a[k] > bval) {
		    bval = a[k];
		}
/* L25: */
	    }
	    if (bval < bmax) {
		bmax = bval;
	    }
/* L30: */
	}
	bmax *= 1.001f;
    }
/* Initialize BVAL,BMIN */
    bval = 0.f;
    bmin = 0.f;
/* Initialize LENL,LEN,LENH,W,WLEN according to BMAX. */
/* Set LEN(J), LENH(J) just after last entry in column J. */
/* Set LENL(J) just after last entry in column J with value ge BMAX. */
    wlen = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ip[j + 1] - ip[j];
	lenh[j] = l;
	len[j] = l;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    if (a[k] < bmax) {
		goto L46;
	    }
/* L45: */
	}
/* Column J is empty or all entries are ge BMAX */
	k = ip[j + 1];
L46:
	lenl[j] = k - ip[j];
/* Add J to W if LENL(J) ne LENH(J) */
	if (lenl[j] == l) {
	    goto L48;
	}
	++wlen;
	w[wlen] = j;
L48:
	;
    }
/* Main loop */
    i__1 = *ne;
    for (idum1 = 1; idum1 <= i__1; ++idum1) {
	if (num == *numx) {
/* We have a maximum matching in IW; store IW in IPERM */
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		iperm[i__] = iw[i__];
/* L50: */
	    }
/* Keep going round this loop until matching IW is no longer maximum. */
	    i__2 = *ne;
	    for (idum2 = 1; idum2 <= i__2; ++idum2) {
		bmin = bval;
		if (bmax == bmin) {
		    goto L99;
		}
/* Find splitting value BVAL */
		mc64qd_(&ip[1], &lenl[1], &len[1], &w[1], &wlen, &a[1], &nval,
			 &bval);
		if (nval <= 1) {
		    goto L99;
		}
/* Set LEN such that all matrix entries with value lt BVAL are */
/* discarded. Store old LEN in LENH. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
		k = 1;
		i__3 = *n;
		for (idum3 = 1; idum3 <= i__3; ++idum3) {
		    if (k > wlen) {
			goto L71;
		    }
		    j = w[k];
		    i__4 = ip[j] + lenl[j];
		    for (ii = ip[j] + len[j] - 1; ii >= i__4; --ii) {
			if (a[ii] >= bval) {
			    goto L60;
			}
			i__ = irn[ii];
			if (iw[i__] != j) {
			    goto L55;
			}
/* Remove entry from matching */
			iw[i__] = 0;
			--num;
			fc[*n - num] = j;
L55:
			;
		    }
L60:
		    lenh[j] = len[j];
/* IP(J)+LEN(J)-1 is last entry in column ge BVAL */
		    len[j] = ii - ip[j] + 1;
/* If LENH(J) = LENL(J), remove J from W */
		    if (lenl[j] == lenh[j]) {
			w[k] = w[wlen];
			--wlen;
		    } else {
			++k;
		    }
/* L70: */
		}
L71:
		if (num < *numx) {
		    goto L81;
		}
/* L80: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L81:
	    mod = 1;
	} else {
/* We do not have a maximum matching in IW. */
	    bmax = bval;
/* BMIN is the bottleneck value of a maximum matching; */
/* for BMAX the matching is not maximum, so BMAX>BMIN */
/*          IF (BMAX .EQ. BMIN) GO TO 99 */
/* Find splitting value BVAL */
	    mc64qd_(&ip[1], &len[1], &lenh[1], &w[1], &wlen, &a[1], &nval, &
		    bval);
	    if (nval == 0 || bval == bmin) {
		goto L99;
	    }
/* Set LEN such that all matrix entries with value ge BVAL are */
/* inside matrix. Store old LEN in LENL. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
	    k = 1;
	    i__2 = *n;
	    for (idum3 = 1; idum3 <= i__2; ++idum3) {
		if (k > wlen) {
		    goto L88;
		}
		j = w[k];
		i__3 = ip[j] + lenh[j] - 1;
		for (ii = ip[j] + len[j]; ii <= i__3; ++ii) {
		    if (a[ii] < bval) {
			goto L86;
		    }
/* L85: */
		}
L86:
		lenl[j] = len[j];
		len[j] = ii - ip[j];
		if (lenl[j] == lenh[j]) {
		    w[k] = w[wlen];
		    --wlen;
		} else {
		    ++k;
		}
/* L87: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L88:
	    mod = 0;
	}
	++cnt;
	mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], &
		num, numx, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*
		n * 3 + 1]);
/* IW contains maximum matching of length NUM */
/* L90: */
    }
/* End of dummy loop; this point is never reached */
/* BMIN is bottleneck value of final matching */
L99:
    if (*numx == *n) {
	goto L1000;
    }
/* The matrix is structurally singular, complete IPERM */
/* W, IW are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	w[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    iw[k] = i__;
	} else {
	    j = iperm[i__];
	    w[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (w[j] != 0) {
	    goto L320;
	}
	++k;
	idum1 = iw[k];
	iperm[idum1] = j;
L320:
	;
    }
L1000:
    return 0;
}